

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_interface_test.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_512f7::StatTestTwoStep::Run(StatTestTwoStep *this)

{
  Test *pTVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  Node *pNVar5;
  size_type sVar6;
  reference pvVar7;
  allocator<char> local_d1;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  undefined4 local_84;
  undefined1 local_80 [8];
  string err;
  allocator<char> local_49;
  string local_48;
  Node *local_28;
  Node *out;
  int local_14;
  StatTestTwoStep *pSStack_10;
  int fail_count;
  StatTestTwoStep *this_local;
  
  pSStack_10 = this;
  local_14 = testing::Test::AssertionFailures(g_current_test);
  ManifestParserOptions::ManifestParserOptions((ManifestParserOptions *)((long)&out + 4));
  AssertParse(&(this->super_StatTest).super_StateTestWithBuiltinRules.state_,
              "build out: cat mid\nbuild mid: cat in\n",stack0xffffffffffffffe4);
  iVar2 = local_14;
  iVar4 = testing::Test::AssertionFailures(g_current_test);
  if (iVar2 == iVar4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"out",&local_49);
    pNVar5 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    local_28 = pNVar5;
    std::__cxx11::string::string((string *)local_80);
    pTVar1 = g_current_test;
    bVar3 = Node::Stat(local_28,&(this->super_StatTest).super_DiskInterface,(string *)local_80);
    testing::Test::Check
              (pTVar1,bVar3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/disk_interface_test.cc"
               ,0x112,"out->Stat(this, &err)");
    pTVar1 = g_current_test;
    bVar3 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_80);
    testing::Test::Check
              (pTVar1,bVar3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/disk_interface_test.cc"
               ,0x113,"\"\" == err");
    pTVar1 = g_current_test;
    sVar6 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&(this->super_StatTest).stats_);
    bVar3 = testing::Test::Check
                      (pTVar1,sVar6 == 1,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/disk_interface_test.cc"
                       ,0x114,"1u == stats_.size()");
    if (bVar3) {
      DependencyScan::RecomputeDirty(&(this->super_StatTest).scan_,local_28,(string *)0x0);
      pTVar1 = g_current_test;
      sVar6 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&(this->super_StatTest).stats_);
      bVar3 = testing::Test::Check
                        (pTVar1,sVar6 == 3,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/disk_interface_test.cc"
                         ,0x116,"3u == stats_.size()");
      pTVar1 = g_current_test;
      if (bVar3) {
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&(this->super_StatTest).stats_,0);
        bVar3 = std::operator==("out",pvVar7);
        bVar3 = testing::Test::Check
                          (pTVar1,bVar3,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/disk_interface_test.cc"
                           ,0x117,"\"out\" == stats_[0]");
        pTVar1 = g_current_test;
        if (bVar3) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"out",&local_a9);
          pNVar5 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_a8);
          bVar3 = Node::dirty(pNVar5);
          bVar3 = testing::Test::Check
                            (pTVar1,bVar3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/disk_interface_test.cc"
                             ,0x118,"GetNode(\"out\")->dirty()");
          std::__cxx11::string::~string((string *)&local_a8);
          std::allocator<char>::~allocator(&local_a9);
          pTVar1 = g_current_test;
          if (((bVar3 ^ 0xffU) & 1) == 0) {
            pvVar7 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](&(this->super_StatTest).stats_,1);
            bVar3 = std::operator==("mid",pvVar7);
            bVar3 = testing::Test::Check
                              (pTVar1,bVar3,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/disk_interface_test.cc"
                               ,0x119,"\"mid\" == stats_[1]");
            pTVar1 = g_current_test;
            if (bVar3) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_d0,"mid",&local_d1);
              pNVar5 = StateTestWithBuiltinRules::GetNode
                                 ((StateTestWithBuiltinRules *)this,&local_d0);
              bVar3 = Node::dirty(pNVar5);
              bVar3 = testing::Test::Check
                                (pTVar1,bVar3,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/disk_interface_test.cc"
                                 ,0x11a,"GetNode(\"mid\")->dirty()");
              std::__cxx11::string::~string((string *)&local_d0);
              std::allocator<char>::~allocator(&local_d1);
              pTVar1 = g_current_test;
              if (((bVar3 ^ 0xffU) & 1) == 0) {
                pvVar7 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[](&(this->super_StatTest).stats_,2);
                bVar3 = std::operator==("in",pvVar7);
                bVar3 = testing::Test::Check
                                  (pTVar1,bVar3,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/disk_interface_test.cc"
                                   ,0x11b,"\"in\" == stats_[2]");
                if (bVar3) {
                  local_84 = 0;
                }
                else {
                  testing::Test::AddAssertionFailure(g_current_test);
                  local_84 = 1;
                }
              }
              else {
                testing::Test::AddAssertionFailure(g_current_test);
                local_84 = 1;
              }
            }
            else {
              testing::Test::AddAssertionFailure(g_current_test);
              local_84 = 1;
            }
          }
          else {
            testing::Test::AddAssertionFailure(g_current_test);
            local_84 = 1;
          }
        }
        else {
          testing::Test::AddAssertionFailure(g_current_test);
          local_84 = 1;
        }
      }
      else {
        testing::Test::AddAssertionFailure(g_current_test);
        local_84 = 1;
      }
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
      local_84 = 1;
    }
    std::__cxx11::string::~string((string *)local_80);
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  return;
}

Assistant:

TEST_F(StatTest, TwoStep) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"build out: cat mid\n"
"build mid: cat in\n"));

  Node* out = GetNode("out");
  string err;
  EXPECT_TRUE(out->Stat(this, &err));
  EXPECT_EQ("", err);
  ASSERT_EQ(1u, stats_.size());
  scan_.RecomputeDirty(out, NULL);
  ASSERT_EQ(3u, stats_.size());
  ASSERT_EQ("out", stats_[0]);
  ASSERT_TRUE(GetNode("out")->dirty());
  ASSERT_EQ("mid",  stats_[1]);
  ASSERT_TRUE(GetNode("mid")->dirty());
  ASSERT_EQ("in",  stats_[2]);
}